

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O2

int menu_bar_x_offset_proc(Am_Object *self)

{
  int iVar1;
  undefined8 in_RAX;
  Am_Value *pAVar2;
  Am_Widget_Look look;
  Am_Widget_Look local_14;
  
  local_14.value = (Am_Widget_Look_vals)((ulong)in_RAX >> 0x20);
  pAVar2 = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&local_14,pAVar2);
  pAVar2 = Am_Object::Get(self,0x1c8,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  if (local_14.value == Am_MOTIF_LOOK.value) {
    iVar1 = iVar1 + 3;
  }
  return iVar1;
}

Assistant:

Am_Define_Formula(int, menu_bar_x_offset)
{
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  int border = self.Get(Am_MENU_BORDER);
  if (look == Am_MOTIF_LOOK)
    return border + 3;
  else
    return border;
}